

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O0

void __thiscall Clasp::SolverStrategies::prepare(SolverStrategies *this)

{
  SolverStrategies *this_local;
  
  if ((SUB84(*this,4) >> 0x13 & 1) == 1) {
    *this = (SolverStrategies)((ulong)*this & 0xffffffffffff0000);
    *this = (SolverStrategies)((ulong)*this & 0xffffffff0000ffff);
    *this = (SolverStrategies)((ulong)*this & 0xffffffe7ffffffff);
    *this = (SolverStrategies)((ulong)*this & 0xffffff9fffffffff);
    *this = (SolverStrategies)((ulong)*this & 0xfffffe7fffffffff);
    *this = (SolverStrategies)((ulong)*this & 0xfffff9ffffffffff | 0x60000000000);
    *this = (SolverStrategies)((ulong)*this & 0xfffbffffffffffff);
  }
  return;
}

Assistant:

void SolverStrategies::prepare() {
	if (search == SolverStrategies::no_learning) {
		compress    = 0;
		saveProgress= 0;
		reverseArcs = 0;
		otfs        = 0;
		updateLbd   = 0;
		ccMinAntes  = SolverStrategies::no_antes;
		bumpVarAct  = 0;
	}
}